

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O2

void resize_convolve(__m256i *s,__m256i *coeffs,__m256i *res_out)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  auVar3 = vpmaddubsw_avx2((undefined1  [32])*s,(undefined1  [32])*coeffs);
  auVar4 = vpmaddubsw_avx2((undefined1  [32])s[1],(undefined1  [32])coeffs[1]);
  auVar5 = vpmaddubsw_avx2((undefined1  [32])s[2],(undefined1  [32])coeffs[2]);
  auVar6 = vpmaddubsw_avx2((undefined1  [32])s[3],(undefined1  [32])coeffs[3]);
  auVar3 = vpaddw_avx2(auVar4,auVar3);
  auVar4 = vpaddw_avx2(auVar6,auVar5);
  auVar5 = vpmovsxwd_avx2(auVar3._0_16_);
  auVar3 = vpmovsxwd_avx2(auVar3._16_16_);
  auVar6 = vpmovsxwd_avx2(auVar4._0_16_);
  alVar1 = (__m256i)vpaddd_avx2(auVar6,auVar5);
  auVar4 = vpmovsxwd_avx2(auVar4._16_16_);
  alVar2 = (__m256i)vpaddd_avx2(auVar4,auVar3);
  *res_out = alVar1;
  res_out[1] = alVar2;
  return;
}

Assistant:

static inline void resize_convolve(const __m256i *const s,
                                   const __m256i *const coeffs,
                                   __m256i *res_out) {
  const __m256i res_0 = _mm256_maddubs_epi16(s[0], coeffs[0]);
  const __m256i res_1 = _mm256_maddubs_epi16(s[1], coeffs[1]);
  const __m256i res_2 = _mm256_maddubs_epi16(s[2], coeffs[2]);
  const __m256i res_3 = _mm256_maddubs_epi16(s[3], coeffs[3]);

  const __m256i dst_0 = _mm256_add_epi16(res_0, res_1);
  const __m256i dst_1 = _mm256_add_epi16(res_2, res_3);
  // The sum of convolve operation crosses signed 16bit. Hence, the addition
  // should happen in 32bit.
  const __m256i dst_00 = _mm256_cvtepi16_epi32(CAST_LOW(dst_0));
  const __m256i dst_01 =
      _mm256_cvtepi16_epi32(_mm256_extracti128_si256(dst_0, 1));
  const __m256i dst_10 = _mm256_cvtepi16_epi32(CAST_LOW(dst_1));
  const __m256i dst_11 =
      _mm256_cvtepi16_epi32(_mm256_extracti128_si256(dst_1, 1));

  res_out[0] = _mm256_add_epi32(dst_00, dst_10);
  res_out[1] = _mm256_add_epi32(dst_01, dst_11);
}